

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

float_specs
fmt::v6::internal::parse_float_type_spec<fmt::v6::internal::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar2 = (byte)specs->field_0x9 >> 7;
  uVar3 = (uint)bVar2 << 0x15;
  uVar4 = (uint)bVar2 << 0x15;
  cVar1 = specs->type;
  switch(cVar1) {
  case 'A':
    uVar4 = uVar3 | 0x10000;
LAB_0015946a:
    uVar4 = uVar4 | 3;
    break;
  case 'B':
  case 'C':
  case 'D':
switchD_0015942e_caseD_68:
    error_handler::on_error(eh,"invalid type specifier");
  case 'E':
    uVar3 = 0x10000;
switchD_0015942e_caseD_65:
    uVar4 = (uVar3 & 0x1ffffe) + (uint)(specs->precision != 0 | bVar2) * 0x200000 + 1;
    break;
  case 'F':
    uVar3 = 0x10000;
switchD_0015942e_caseD_66:
    uVar4 = (uVar3 & 0x1ffffd) + (uint)(specs->precision != 0 | bVar2) * 0x200000 + 2;
    break;
  case 'G':
    uVar4 = uVar3 | 0x10000;
    break;
  default:
    switch(cVar1) {
    case 'e':
      goto switchD_0015942e_caseD_65;
    case 'f':
      goto switchD_0015942e_caseD_66;
    case 'g':
      break;
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
      goto switchD_0015942e_caseD_68;
    case 'n':
      uVar4 = uVar3 | 0x20000;
      break;
    default:
      if (cVar1 != 'a') {
        if (cVar1 != '\0') goto switchD_0015942e_caseD_68;
        uVar4 = (uint)(0 < specs->precision | bVar2) << 0x15;
        break;
      }
      goto LAB_0015946a;
    }
  }
  return (float_specs)((ulong)uVar4 << 0x20);
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.showpoint = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.showpoint |= specs.precision > 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}